

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_def.c
# Opt level: O1

int free_form(FORM *form)

{
  int *piVar1;
  int iVar2;
  
  if (form == (FORM *)0x0) {
    iVar2 = -2;
  }
  else {
    iVar2 = -3;
    if ((form->status & 1) == 0) {
      Disconnect_Fields(form);
      if (form->page != (_PAGE *)0x0) {
        free(form->page);
      }
      free(form);
      iVar2 = 0;
    }
  }
  piVar1 = __errno_location();
  *piVar1 = iVar2;
  return iVar2;
}

Assistant:

int free_form(FORM * form)
{
  if ( !form )	
    RETURN(E_BAD_ARGUMENT);

  if ( form->status & _POSTED)  
    RETURN(E_POSTED);
  
  Disconnect_Fields( form );
  if (form->page) 
    free(form->page);
  free(form);
  
  RETURN(E_OK);
}